

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmReset(jx9_vm *pVm)

{
  jx9_vm *pVm_local;
  
  if ((pVm->nMagic == 0xba851227) || (pVm->nMagic == 0xcdfe1dad)) {
    SyBlobReset(&pVm->sConsumer);
    jx9MemObjRelease(&pVm->sExec);
    pVm->nMagic = 0xba851227;
    pVm_local._4_4_ = 0;
  }
  else {
    pVm_local._4_4_ = -0x18;
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmReset(jx9_vm *pVm)
{
	if( pVm->nMagic != JX9_VM_RUN && pVm->nMagic != JX9_VM_EXEC ){
		return SXERR_CORRUPT;
	}
	/* TICKET 1433-003: As of this version, the VM is automatically reset */
	SyBlobReset(&pVm->sConsumer);
	jx9MemObjRelease(&pVm->sExec);
	/* Set the ready flag */
	pVm->nMagic = JX9_VM_RUN;
	return SXRET_OK;
}